

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void repeatstat(LexState *ls,int line)

{
  FuncState *fs_00;
  int target;
  int list;
  undefined1 local_58 [8];
  BlockCnt bl2;
  BlockCnt bl1;
  int repeat_init;
  FuncState *fs;
  int condexit;
  int line_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  target = luaK_getlabel(fs_00);
  enterblock(fs_00,(BlockCnt *)&bl2.nactvar,'\x01');
  enterblock(fs_00,(BlockCnt *)local_58,'\0');
  luaX_next(ls);
  statlist(ls);
  check_match(ls,0x115,0x111,line);
  list = cond(ls);
  if (bl2.firstlabel._1_1_ != '\0') {
    luaK_patchclose(fs_00,list,(uint)(byte)bl2.firstlabel);
  }
  leaveblock(fs_00);
  luaK_patchlist(fs_00,list,target);
  leaveblock(fs_00);
  return;
}

Assistant:

static void repeatstat (LexState *ls, int line) {
  /* repeatstat -> REPEAT block UNTIL cond */
  int condexit;
  FuncState *fs = ls->fs;
  int repeat_init = luaK_getlabel(fs);
  BlockCnt bl1, bl2;
  enterblock(fs, &bl1, 1);  /* loop block */
  enterblock(fs, &bl2, 0);  /* scope block */
  luaX_next(ls);  /* skip REPEAT */
  statlist(ls);
  check_match(ls, TK_UNTIL, TK_REPEAT, line);
  condexit = cond(ls);  /* read condition (inside scope block) */
  if (bl2.upval)  /* upvalues? */
    luaK_patchclose(fs, condexit, bl2.nactvar);
  leaveblock(fs);  /* finish scope */
  luaK_patchlist(fs, condexit, repeat_init);  /* close the loop */
  leaveblock(fs);  /* finish loop */
}